

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O0

void testTiledCopyPixels(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  int YS;
  int DY;
  int DX;
  int H;
  int W;
  int in_stack_00000044;
  int in_stack_00000048;
  int in_stack_0000004c;
  int in_stack_00000070;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing fast pixel copying for tiled files");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_239dcf::writeCopyRead
            (tempDir,in_stack_0000004c,in_stack_00000048,in_stack_00000044,W,H,in_stack_00000070);
  anon_unknown.dwarf_239dcf::writeCopyRead
            (tempDir,in_stack_0000004c,in_stack_00000048,in_stack_00000044,W,H,in_stack_00000070);
  anon_unknown.dwarf_239dcf::writeCopyRead
            (tempDir,in_stack_0000004c,in_stack_00000048,in_stack_00000044,W,H,in_stack_00000070);
  anon_unknown.dwarf_239dcf::writeCopyRead
            (tempDir,in_stack_0000004c,in_stack_00000048,in_stack_00000044,W,H,in_stack_00000070);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testTiledCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying for tiled files" << endl;

        const int W  = 171;
        const int H  = 259;
        const int DX = 17;
        const int DY = 29;
        const int YS = 55;

        writeCopyRead (tempDir, W, H, DX, YS, 0, 0);
        writeCopyRead (tempDir, W, H, DX, YS, 0, DY);
        writeCopyRead (tempDir, W, H, DX, YS, DX, 0);
        writeCopyRead (tempDir, W, H, DX, YS, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}